

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O0

void Gia_IsoPrepare(Gia_IsoMan_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  undefined4 *__ptr_00;
  bool bVar4;
  int local_34;
  int MaxLev;
  int iObj;
  int i;
  int *pLevSizes;
  int *pLevBegins;
  Gia_Obj_t *pObj;
  Gia_IsoMan_t *p_local;
  
  local_34 = 0;
  *p->pLevels = 0;
  MaxLev = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->pGia->vCis);
    bVar4 = false;
    if (MaxLev < iVar2) {
      pLevBegins = (int *)Gia_ManCi(p->pGia,MaxLev);
      bVar4 = (Gia_Obj_t *)pLevBegins != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    piVar1 = p->pLevels;
    iVar2 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pLevBegins);
    piVar1[iVar2] = 0;
    MaxLev = MaxLev + 1;
  }
  MaxLev = 0;
  while( true ) {
    bVar4 = false;
    if (MaxLev < p->pGia->nObjs) {
      pLevBegins = (int *)Gia_ManObj(p->pGia,MaxLev);
      bVar4 = (Gia_Obj_t *)pLevBegins != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)pLevBegins);
    if (iVar2 != 0) {
      piVar1 = p->pLevels;
      iVar2 = Gia_ObjFaninId0((Gia_Obj_t *)pLevBegins,MaxLev);
      iVar2 = piVar1[iVar2];
      piVar1 = p->pLevels;
      iVar3 = Gia_ObjFaninId1((Gia_Obj_t *)pLevBegins,MaxLev);
      iVar2 = Abc_MaxInt(iVar2,piVar1[iVar3]);
      p->pLevels[MaxLev] = iVar2 + 1;
    }
    MaxLev = MaxLev + 1;
  }
  MaxLev = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->pGia->vCos);
    bVar4 = false;
    if (MaxLev < iVar2) {
      pLevBegins = (int *)Gia_ManCo(p->pGia,MaxLev);
      bVar4 = (Gia_Obj_t *)pLevBegins != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar2 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pLevBegins);
    piVar1 = p->pLevels;
    iVar3 = Gia_ObjFaninId0((Gia_Obj_t *)pLevBegins,iVar2);
    p->pLevels[iVar2] = piVar1[iVar3] + 1;
    piVar1 = p->pLevels;
    iVar2 = Gia_ObjId(p->pGia,(Gia_Obj_t *)pLevBegins);
    local_34 = Abc_MaxInt(local_34,piVar1[iVar2]);
    MaxLev = MaxLev + 1;
  }
  __ptr = calloc((long)(local_34 + 1),4);
  for (MaxLev = 1; MaxLev < p->nObjs; MaxLev = MaxLev + 1) {
    *(int *)((long)__ptr + (long)p->pLevels[MaxLev] * 4) =
         *(int *)((long)__ptr + (long)p->pLevels[MaxLev] * 4) + 1;
  }
  Vec_IntClear(p->vClasses);
  Vec_IntPush(p->vClasses,0);
  Vec_IntPush(p->vClasses,1);
  __ptr_00 = (undefined4 *)calloc((long)(local_34 + 2),4);
  *__ptr_00 = 1;
  MaxLev = 0;
  while( true ) {
    if (local_34 < MaxLev) {
      if (__ptr_00[local_34 + 1] != p->nObjs) {
        __assert_fail("pLevBegins[MaxLev+1] == p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                      ,0xf0,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
      }
      for (MaxLev = 1; MaxLev < p->nObjs; MaxLev = MaxLev + 1) {
        iVar2 = __ptr_00[p->pLevels[MaxLev]];
        __ptr_00[p->pLevels[MaxLev]] = iVar2 + 1;
        Gia_IsoSetItem(p,iVar2,MaxLev);
      }
      if (__ptr_00 != (undefined4 *)0x0) {
        free(__ptr_00);
      }
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return;
    }
    if (*(int *)((long)__ptr + (long)MaxLev * 4) < 1) break;
    Vec_IntPush(p->vClasses,__ptr_00[MaxLev]);
    Vec_IntPush(p->vClasses,*(int *)((long)__ptr + (long)MaxLev * 4));
    __ptr_00[MaxLev + 1] = __ptr_00[MaxLev] + *(int *)((long)__ptr + (long)MaxLev * 4);
    MaxLev = MaxLev + 1;
  }
  __assert_fail("pLevSizes[i] > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                ,0xeb,"void Gia_IsoPrepare(Gia_IsoMan_t *)");
}

Assistant:

void Gia_IsoPrepare( Gia_IsoMan_t * p )
{
    Gia_Obj_t * pObj;
    int * pLevBegins, * pLevSizes;
    int i, iObj, MaxLev = 0;
    // assign levels
    p->pLevels[0] = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        p->pLevels[Gia_ObjId(p->pGia, pObj)] = 0;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        p->pLevels[i] = 1 + Abc_MaxInt( p->pLevels[Gia_ObjFaninId0(pObj, i)], p->pLevels[Gia_ObjFaninId1(pObj, i)] );
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iObj = Gia_ObjId(p->pGia, pObj);
        p->pLevels[iObj] = 1 + p->pLevels[Gia_ObjFaninId0(pObj, iObj)]; // "1 +" is different!
        MaxLev = Abc_MaxInt( MaxLev, p->pLevels[Gia_ObjId(p->pGia, pObj)] );
    }

    // count nodes on each level
    pLevSizes = ABC_CALLOC( int, MaxLev+1 );
    for ( i = 1; i < p->nObjs; i++ )
        pLevSizes[p->pLevels[i]]++;
    // start classes
    Vec_IntClear( p->vClasses );
    Vec_IntPush( p->vClasses, 0 );
    Vec_IntPush( p->vClasses, 1 );
    // find beginning of each level
    pLevBegins = ABC_CALLOC( int, MaxLev+2 );
    pLevBegins[0] = 1;
    for ( i = 0; i <= MaxLev; i++ )
    {
        assert( pLevSizes[i] > 0 ); // we do not allow AIG with a const node and no PIs
        Vec_IntPush( p->vClasses, pLevBegins[i] );
        Vec_IntPush( p->vClasses, pLevSizes[i] );
        pLevBegins[i+1] = pLevBegins[i] + pLevSizes[i];
    }
    assert( pLevBegins[MaxLev+1] == p->nObjs );
    // put them into the structure
    for ( i = 1; i < p->nObjs; i++ )
        Gia_IsoSetItem( p, pLevBegins[p->pLevels[i]]++, i );
    ABC_FREE( pLevBegins );
    ABC_FREE( pLevSizes );
/*
    // print the results
    for ( i = 0; i < p->nObjs; i++ )
        printf( "%3d : (%d,%d)\n", i, Gia_IsoGetItem(p, i), Gia_IsoGetValue(p, i) );
    printf( "\n" );
*/
}